

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O1

int archive_format_gnutar_header(archive_write *a,char *h,archive_entry *entry,int tartype)

{
  byte *pbVar1;
  undefined4 uVar2;
  void *pvVar3;
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  mode_t mVar8;
  char *pcVar9;
  ulong uVar10;
  size_t sVar11;
  size_t sVar12;
  ulong uVar13;
  int64_t iVar14;
  byte *pbVar15;
  dev_t dVar16;
  char *pcVar17;
  long lVar18;
  dev_t dVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  
  pvVar3 = a->format_data;
  memcpy(h,"",0x200);
  uVar21 = tartype - 0x4b;
  if (uVar21 < 2) {
    pcVar9 = archive_entry_pathname(entry);
    uVar10 = strlen(pcVar9);
  }
  else {
    pcVar9 = *(char **)((long)pvVar3 + 0x20);
    uVar10 = *(ulong *)((long)pvVar3 + 0x28);
  }
  if (99 < uVar10) {
    uVar10 = 100;
  }
  memcpy(h,pcVar9,uVar10);
  uVar10 = *(ulong *)((long)pvVar3 + 0x18);
  if (uVar10 != 0) {
    sVar11 = 100;
    if (uVar10 < 100) {
      sVar11 = uVar10;
    }
    memcpy(h + 0x9d,*(void **)((long)pvVar3 + 0x10),sVar11);
  }
  if (uVar21 < 2) {
    pcVar9 = archive_entry_uname(entry);
    uVar10 = strlen(pcVar9);
  }
  else {
    pcVar9 = *(char **)((long)pvVar3 + 0x30);
    uVar10 = *(ulong *)((long)pvVar3 + 0x38);
  }
  if (uVar10 != 0) {
    sVar11 = 0x20;
    if (uVar10 < 0x20) {
      sVar11 = uVar10;
    }
    memcpy(h + 0x109,pcVar9,sVar11);
  }
  if (uVar21 < 2) {
    pcVar9 = archive_entry_gname(entry);
    sVar11 = strlen(pcVar9);
  }
  else {
    pcVar9 = *(char **)((long)pvVar3 + 0x40);
    sVar11 = *(size_t *)((long)pvVar3 + 0x48);
  }
  if (sVar11 != 0) {
    sVar12 = strlen(pcVar9);
    if (0x20 < sVar12) {
      sVar11 = 0x20;
    }
    memcpy(h + 0x129,pcVar9,sVar11);
  }
  mVar8 = archive_entry_mode(entry);
  uVar21 = 8;
  uVar10 = (ulong)(mVar8 & 0xfff);
  pcVar9 = h + 0x6b;
  do {
    pcVar17 = pcVar9;
    uVar13 = uVar10;
    pcVar17[-1] = (byte)uVar13 & 7 | 0x30;
    uVar21 = uVar21 - 1;
    uVar10 = uVar13 >> 3;
    pcVar9 = pcVar17 + -1;
  } while (1 < uVar21);
  if (7 < uVar13) {
    builtin_strncpy(pcVar17 + -1,"7777777",7);
  }
  uVar13 = archive_entry_uid(entry);
  uVar10 = 0;
  if (0 < (long)uVar13) {
    uVar10 = uVar13;
  }
  uVar21 = 8;
  pcVar9 = h + 0x73;
  do {
    uVar13 = uVar10;
    pcVar17 = pcVar9;
    pcVar17[-1] = (byte)uVar13 & 7 | 0x30;
    uVar21 = uVar21 - 1;
    pcVar9 = pcVar17 + -1;
    uVar10 = uVar13 >> 3;
  } while (1 < uVar21);
  iVar20 = 0;
  if (7 < uVar13) {
    builtin_strncpy(pcVar17 + -1,"7777777",7);
    archive_entry_uid(entry);
    archive_set_error(&a->archive,0x22,"Numeric user ID %jd too large");
    iVar20 = -0x19;
  }
  uVar13 = archive_entry_gid(entry);
  uVar10 = 0;
  if (0 < (long)uVar13) {
    uVar10 = uVar13;
  }
  uVar21 = 8;
  pcVar9 = h + 0x7b;
  do {
    uVar13 = uVar10;
    pcVar17 = pcVar9;
    pcVar17[-1] = (byte)uVar13 & 7 | 0x30;
    uVar21 = uVar21 - 1;
    pcVar9 = pcVar17 + -1;
    uVar10 = uVar13 >> 3;
  } while (1 < uVar21);
  if (7 < uVar13) {
    builtin_strncpy(pcVar17 + -1,"7777777",7);
    iVar14 = archive_entry_gid(entry);
    archive_set_error(&a->archive,0x22,"Numeric group ID %jd too large",iVar14);
    iVar20 = -0x19;
  }
  uVar10 = archive_entry_size(entry);
  pbVar1 = (byte *)(h + 0x7c);
  if ((long)uVar10 < 0x200000000) {
    uVar13 = 0;
    if (0 < (long)uVar10) {
      uVar13 = uVar10;
    }
    pbVar15 = (byte *)(h + 0x86);
    uVar21 = 0xc;
    do {
      uVar10 = uVar13;
      *pbVar15 = (byte)uVar10 & 7 | 0x30;
      uVar21 = uVar21 - 1;
      pbVar15 = pbVar15 + -1;
      uVar13 = uVar10 >> 3;
    } while (1 < uVar21);
    if (7 < uVar10) {
      pbVar1[0] = 0x37;
      pbVar1[1] = 0x37;
      pbVar1[2] = 0x37;
      pbVar1[3] = 0x37;
      pbVar1[4] = 0x37;
      pbVar1[5] = 0x37;
      pbVar1[6] = 0x37;
      pbVar1[7] = 0x37;
      h[0x83] = '7';
      h[0x84] = '7';
      h[0x85] = '7';
      h[0x86] = '7';
      archive_set_error(&a->archive,0x22,"File size out of range");
      iVar20 = -0x19;
    }
  }
  else {
    pcVar9 = h + 0x87;
    uVar21 = 0xd;
    do {
      *pcVar9 = (char)uVar10;
      uVar10 = uVar10 >> 8;
      uVar21 = uVar21 - 1;
      pcVar9 = pcVar9 + -1;
    } while (1 < uVar21);
    *pbVar1 = *pbVar1 | 0x80;
  }
  uVar13 = archive_entry_mtime(entry);
  uVar10 = 0;
  if (0 < (long)uVar13) {
    uVar10 = uVar13;
  }
  uVar21 = 0xc;
  pcVar9 = h + 0x93;
  do {
    uVar13 = uVar10;
    pcVar17 = pcVar9;
    pcVar17[-1] = (byte)uVar13 & 7 | 0x30;
    uVar21 = uVar21 - 1;
    pcVar9 = pcVar17 + -1;
    uVar10 = uVar13 >> 3;
  } while (1 < uVar21);
  if (7 < uVar13) {
    builtin_strncpy(pcVar17 + -1,"77777777777",0xb);
  }
  mVar8 = archive_entry_filetype(entry);
  if (mVar8 != 0x6000) {
    mVar8 = archive_entry_filetype(entry);
    if (mVar8 != 0x2000) goto LAB_001530c7;
  }
  dVar16 = archive_entry_rdevmajor(entry);
  dVar19 = 0;
  if (0 < (long)dVar16) {
    dVar19 = dVar16;
  }
  uVar21 = 7;
  pcVar9 = h + 0x14f;
  do {
    uVar10 = dVar19;
    pcVar17 = pcVar9;
    pcVar17[-1] = (byte)uVar10 & 7 | 0x30;
    uVar21 = uVar21 - 1;
    pcVar9 = pcVar17 + -1;
    dVar19 = uVar10 >> 3;
  } while (1 < uVar21);
  if (7 < uVar10) {
    builtin_strncpy(pcVar17 + -1,"777777",6);
    archive_set_error(&a->archive,0x22,"Major device number too large");
    iVar20 = -0x19;
  }
  dVar16 = archive_entry_rdevminor(entry);
  dVar19 = 0;
  if (0 < (long)dVar16) {
    dVar19 = dVar16;
  }
  uVar21 = 7;
  pcVar9 = h + 0x157;
  do {
    uVar10 = dVar19;
    pcVar17 = pcVar9;
    pcVar17[-1] = (byte)uVar10 & 7 | 0x30;
    uVar21 = uVar21 - 1;
    pcVar9 = pcVar17 + -1;
    dVar19 = uVar10 >> 3;
  } while (1 < uVar21);
  if (7 < uVar10) {
    builtin_strncpy(pcVar17 + -1,"777777",6);
    archive_set_error(&a->archive,0x22,"Minor device number too large");
    iVar20 = -0x19;
  }
LAB_001530c7:
  h[0x9c] = (char)tartype;
  lVar18 = 0;
  iVar22 = 0;
  iVar23 = 0;
  iVar24 = 0;
  iVar25 = 0;
  do {
    uVar2 = *(undefined4 *)(h + lVar18);
    uVar10 = (ulong)(ushort)uVar2 & 0xffffffffffff00ff;
    auVar4._8_4_ = 0;
    auVar4._0_8_ = uVar10;
    auVar4[0xc] = (char)((uint)uVar2 >> 0x18);
    auVar5[8] = (char)((uint)uVar2 >> 0x10);
    auVar5._0_8_ = uVar10;
    auVar5[9] = 0;
    auVar5._10_3_ = auVar4._10_3_;
    auVar7._5_8_ = 0;
    auVar7._0_5_ = auVar5._8_5_;
    auVar6[4] = (char)((uint)uVar2 >> 8);
    auVar6._0_4_ = (int)uVar10;
    auVar6[5] = 0;
    auVar6._6_7_ = SUB137(auVar7 << 0x40,6);
    iVar22 = iVar22 + (int)uVar10;
    iVar23 = iVar23 + auVar6._4_4_;
    iVar24 = iVar24 + auVar5._8_4_;
    iVar25 = iVar25 + (uint)(uint3)(auVar4._10_3_ >> 0x10);
    lVar18 = lVar18 + 4;
  } while (lVar18 != 0x200);
  h[0x9a] = '\0';
  uVar21 = 7;
  uVar10 = (ulong)(uint)(iVar25 + iVar23 + iVar24 + iVar22);
  pcVar9 = h + 0x9a;
  do {
    pcVar17 = pcVar9;
    uVar13 = uVar10;
    pcVar17[-1] = (byte)uVar13 & 7 | 0x30;
    uVar21 = uVar21 - 1;
    uVar10 = uVar13 >> 3;
    pcVar9 = pcVar17 + -1;
  } while (1 < uVar21);
  if (7 < uVar13) {
    builtin_strncpy(pcVar17 + -1,"777777",6);
  }
  return iVar20;
}

Assistant:

static int
archive_format_gnutar_header(struct archive_write *a, char h[512],
    struct archive_entry *entry, int tartype)
{
	unsigned int checksum;
	int i, ret;
	size_t copy_length;
	const char *p;
	struct gnutar *gnutar;

	gnutar = (struct gnutar *)a->format_data;

	ret = 0;

	/*
	 * The "template header" already includes the signature,
	 * various end-of-field markers, and other required elements.
	 */
	memcpy(h, &template_header, 512);

	/*
	 * Because the block is already null-filled, and strings
	 * are allowed to exactly fill their destination (without null),
	 * I use memcpy(dest, src, strlen()) here a lot to copy strings.
	 */

	if (tartype == 'K' || tartype == 'L') {
		p = archive_entry_pathname(entry);
		copy_length = strlen(p);
	} else {
		p = gnutar->pathname;
		copy_length = gnutar->pathname_length;
	}
	if (copy_length > GNUTAR_name_size)
		copy_length = GNUTAR_name_size;
	memcpy(h + GNUTAR_name_offset, p, copy_length);

	if ((copy_length = gnutar->linkname_length) > 0) {
		if (copy_length > GNUTAR_linkname_size)
			copy_length = GNUTAR_linkname_size;
		memcpy(h + GNUTAR_linkname_offset, gnutar->linkname,
		    copy_length);
	}

	/* TODO: How does GNU tar handle unames longer than GNUTAR_uname_size? */
	if (tartype == 'K' || tartype == 'L') {
		p = archive_entry_uname(entry);
		copy_length = strlen(p);
	} else {
		p = gnutar->uname;
		copy_length = gnutar->uname_length;
	}
	if (copy_length > 0) {
		if (copy_length > GNUTAR_uname_size)
			copy_length = GNUTAR_uname_size;
		memcpy(h + GNUTAR_uname_offset, p, copy_length);
	}

	/* TODO: How does GNU tar handle gnames longer than GNUTAR_gname_size? */
	if (tartype == 'K' || tartype == 'L') {
		p = archive_entry_gname(entry);
		copy_length = strlen(p);
	} else {
		p = gnutar->gname;
		copy_length = gnutar->gname_length;
	}
	if (copy_length > 0) {
		if (strlen(p) > GNUTAR_gname_size)
			copy_length = GNUTAR_gname_size;
		memcpy(h + GNUTAR_gname_offset, p, copy_length);
	}

	/* By truncating the mode here, we ensure it always fits. */
	format_octal(archive_entry_mode(entry) & 07777,
	    h + GNUTAR_mode_offset, GNUTAR_mode_size);

	/* TODO: How does GNU tar handle large UIDs? */
	if (format_octal(archive_entry_uid(entry),
	    h + GNUTAR_uid_offset, GNUTAR_uid_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric user ID %jd too large",
		    (intmax_t)archive_entry_uid(entry));
		ret = ARCHIVE_FAILED;
	}

	/* TODO: How does GNU tar handle large GIDs? */
	if (format_octal(archive_entry_gid(entry),
	    h + GNUTAR_gid_offset, GNUTAR_gid_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric group ID %jd too large",
		    (intmax_t)archive_entry_gid(entry));
		ret = ARCHIVE_FAILED;
	}

	/* GNU tar supports base-256 here, so should never overflow. */
	if (format_number(archive_entry_size(entry), h + GNUTAR_size_offset,
		GNUTAR_size_size, GNUTAR_size_max_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "File size out of range");
		ret = ARCHIVE_FAILED;
	}

	/* Shouldn't overflow before 2106, since mtime field is 33 bits. */
	format_octal(archive_entry_mtime(entry),
	    h + GNUTAR_mtime_offset, GNUTAR_mtime_size);

	if (archive_entry_filetype(entry) == AE_IFBLK
	    || archive_entry_filetype(entry) == AE_IFCHR) {
		if (format_octal(archive_entry_rdevmajor(entry),
		    h + GNUTAR_rdevmajor_offset,
			GNUTAR_rdevmajor_size)) {
			archive_set_error(&a->archive, ERANGE,
			    "Major device number too large");
			ret = ARCHIVE_FAILED;
		}

		if (format_octal(archive_entry_rdevminor(entry),
		    h + GNUTAR_rdevminor_offset,
			GNUTAR_rdevminor_size)) {
			archive_set_error(&a->archive, ERANGE,
			    "Minor device number too large");
			ret = ARCHIVE_FAILED;
		}
	}

	h[GNUTAR_typeflag_offset] = tartype;

	checksum = 0;
	for (i = 0; i < 512; i++)
		checksum += 255 & (unsigned int)h[i];
	h[GNUTAR_checksum_offset + 6] = '\0'; /* Can't be pre-set in the template. */
	/* h[GNUTAR_checksum_offset + 7] = ' '; */ /* This is pre-set in the template. */
	format_octal(checksum, h + GNUTAR_checksum_offset, 6);
	return (ret);
}